

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value_list.cpp
# Opt level: O1

void __thiscall
Am_Value_List_Data::Am_Value_List_Data(Am_Value_List_Data *this,Am_Value_List_Data *proto)

{
  Am_List_Item *pAVar1;
  Am_List_Item *this_00;
  Am_List_Item *pAVar2;
  Am_List_Item **ppAVar3;
  Am_List_Item *in_value;
  
  (this->super_Am_Wrapper).refs = 1;
  (this->super_Am_Wrapper).super_Am_Registered_Type._vptr_Am_Registered_Type =
       (_func_int **)&PTR_ID_002e40b8;
  ppAVar3 = &this->head;
  in_value = proto->head;
  if (in_value == (Am_List_Item *)0x0) {
    this_00 = (Am_List_Item *)0x0;
  }
  else {
    pAVar2 = (Am_List_Item *)0x0;
    do {
      this_00 = (Am_List_Item *)operator_new(0x20);
      (this_00->super_Am_Value).type = 0;
      (this_00->super_Am_Value).value.wrapper_value = (Am_Wrapper *)0x0;
      this_00->prev = (Am_List_Item *)0x0;
      this_00->next = (Am_List_Item *)0x0;
      Am_Value::operator=((Am_Value *)this_00,&in_value->super_Am_Value);
      pAVar1 = in_value->next;
      this_00->prev = in_value->prev;
      this_00->next = pAVar1;
      this_00->prev = pAVar2;
      *ppAVar3 = this_00;
      ppAVar3 = &this_00->next;
      in_value = in_value->next;
      pAVar2 = this_00;
    } while (in_value != (Am_List_Item *)0x0);
  }
  *ppAVar3 = (Am_List_Item *)0x0;
  this->tail = this_00;
  *(undefined2 *)&(this->super_Am_Wrapper).field_0xc =
       *(undefined2 *)&(proto->super_Am_Wrapper).field_0xc;
  return;
}

Assistant:

Am_Value_List_Data::Am_Value_List_Data(Am_Value_List_Data *proto)
{
  Am_List_Item *current;
  Am_List_Item *prev;
  Am_List_Item *new_item;
  Am_List_Item **list_position;
  list_position = &head;
  new_item = nullptr;
  prev = nullptr;
  for (current = proto->head; current; current = current->next) {
    new_item = new Am_List_Item;
    *new_item = *current;
    new_item->prev = prev;
    *list_position = new_item;
    prev = new_item;
    list_position = &(new_item->next);
  }
  *list_position = nullptr;
  tail = new_item;
  number = proto->number;
}